

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<DataStream,std::array<unsigned_char,4ul>,char[12],unsigned_int,unsigned_char[4]>
               (DataStream *s,array<unsigned_char,_4UL> *args,char (*args_1) [12],uint *args_2,
               uchar (*args_3) [4])

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,_unsigned_char,_4UL>(s,args);
  Serialize<DataStream,_char,_12>(s,args_1);
  ser_writedata32<DataStream>(s,*args_2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    Serialize<DataStream,_unsigned_char,_4>(s,args_3);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}